

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runxmlconf.c
# Opt level: O0

void testErrorHandler(void *userData,xmlError *error)

{
  int iVar1;
  char *local_38;
  int res;
  xmlError *error_local;
  void *userData_local;
  
  if (testErrorsSize < 0x8000) {
    if (error->file == (char *)0x0) {
      local_38 = "entity";
    }
    else {
      local_38 = error->file;
    }
    iVar1 = snprintf(testErrors + testErrorsSize,(long)(0x8000 - testErrorsSize),"%s:%d: %s\n",
                     local_38,(ulong)(uint)error->line,error->message);
    if (error->level == XML_ERR_FATAL) {
      nbFatal = nbFatal + 1;
    }
    else if (error->level == XML_ERR_ERROR) {
      nbError = nbError + 1;
    }
    if (testErrorsSize + iVar1 < 0x8000) {
      testErrorsSize = iVar1 + testErrorsSize;
    }
    else {
      testErrorsSize = 0x8000;
      testErrors[0x8000] = '\0';
    }
    testErrors[testErrorsSize] = '\0';
  }
  return;
}

Assistant:

static void
testErrorHandler(void *userData ATTRIBUTE_UNUSED, const xmlError *error) {
    int res;

    if (testErrorsSize >= 32768)
        return;
    res = snprintf(&testErrors[testErrorsSize],
                    32768 - testErrorsSize,
		   "%s:%d: %s\n", (error->file ? error->file : "entity"),
		   error->line, error->message);
    if (error->level == XML_ERR_FATAL)
        nbFatal++;
    else if (error->level == XML_ERR_ERROR)
        nbError++;
    if (testErrorsSize + res >= 32768) {
        /* buffer is full */
	testErrorsSize = 32768;
	testErrors[testErrorsSize] = 0;
    } else {
        testErrorsSize += res;
    }
    testErrors[testErrorsSize] = 0;
}